

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

aiMatrix4x4 * __thiscall
Assimp::X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent
          (aiMatrix4x4 *__return_storage_ptr__,X3DImporter *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  CX3DImporter_NodeElement *pCVar9;
  undefined8 *******pppppppuVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  _List_node_base *p_Var18;
  undefined8 *******pppppppuVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> matr;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_b8;
  float local_b4;
  undefined8 ******local_38;
  undefined8 ******local_30;
  long local_28;
  
  pppppppuVar19 = &local_38;
  local_30 = pppppppuVar19;
  local_28 = 0;
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  local_38 = pppppppuVar19;
  for (pCVar9 = this->NodeElement_Cur; pCVar9 != (CX3DImporter_NodeElement *)0x0;
      pCVar9 = pCVar9->Parent) {
    if (pCVar9->Type == ENET_Group) {
      p_Var18 = (_List_node_base *)operator_new(0x50);
      p_Var11 = (_List_node_base *)pCVar9[1]._vptr_CX3DImporter_NodeElement;
      p_Var12 = *(_List_node_base **)&pCVar9[1].Type;
      p_Var13 = (_List_node_base *)pCVar9[1].ID._M_dataplus._M_p;
      p_Var14 = (_List_node_base *)pCVar9[1].ID._M_string_length;
      p_Var15 = (_List_node_base *)pCVar9[1].ID.field_2._M_allocated_capacity;
      p_Var16 = *(_List_node_base **)((long)&pCVar9[1].ID.field_2 + 8);
      p_Var17 = pCVar9[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var18[4]._M_next = (_List_node_base *)pCVar9[1].Parent;
      p_Var18[4]._M_prev = p_Var17;
      p_Var18[3]._M_next = p_Var15;
      p_Var18[3]._M_prev = p_Var16;
      p_Var18[2]._M_next = p_Var13;
      p_Var18[2]._M_prev = p_Var14;
      p_Var18[1]._M_next = p_Var11;
      p_Var18[1]._M_prev = p_Var12;
      std::__detail::_List_node_base::_M_hook(p_Var18);
      local_28 = local_28 + 1;
    }
  }
  local_d4 = __return_storage_ptr__->a1;
  fVar35 = __return_storage_ptr__->a2;
  local_d0 = __return_storage_ptr__->b2;
  fVar49 = __return_storage_ptr__->b3;
  fVar44 = __return_storage_ptr__->c3;
  fVar33 = __return_storage_ptr__->c4;
  fVar29 = __return_storage_ptr__->d4;
  if (pppppppuVar19 != (undefined8 *******)local_38) {
    fVar36 = __return_storage_ptr__->a3;
    local_b8 = __return_storage_ptr__->a4;
    fVar27 = __return_storage_ptr__->b1;
    local_b4 = __return_storage_ptr__->b4;
    fVar23 = __return_storage_ptr__->c1;
    fVar53 = __return_storage_ptr__->c2;
    local_cc = __return_storage_ptr__->d1;
    fVar39 = __return_storage_ptr__->d2;
    fVar30 = __return_storage_ptr__->d3;
    do {
      pppppppuVar19 = (undefined8 *******)pppppppuVar19[1];
      fVar1 = *(float *)(pppppppuVar19 + 4);
      fVar2 = *(float *)(pppppppuVar19 + 2);
      fVar3 = *(float *)(pppppppuVar19 + 6);
      fVar31 = *(float *)((long)pppppppuVar19 + 0x14);
      fVar34 = fVar31 * local_d4;
      fVar45 = *(float *)(pppppppuVar19 + 3);
      fVar28 = fVar45 * local_d4;
      fVar43 = *(float *)((long)pppppppuVar19 + 0x2c);
      fVar40 = fVar35 * fVar43;
      fVar48 = *(float *)((long)pppppppuVar19 + 0x1c);
      fVar51 = local_d4 * fVar48;
      fVar4 = *(float *)((long)pppppppuVar19 + 0x34);
      fVar5 = *(float *)(pppppppuVar19 + 7);
      fVar47 = *(float *)((long)pppppppuVar19 + 0x3c);
      fVar50 = fVar36 * fVar47;
      fVar41 = fVar31 * fVar27;
      fVar42 = fVar45 * fVar27;
      fVar24 = fVar27 * fVar48;
      fVar25 = fVar31 * fVar23;
      fVar26 = fVar45 * fVar23;
      fVar20 = fVar23 * fVar48;
      fVar31 = fVar31 * local_cc;
      fVar45 = fVar45 * local_cc;
      fVar48 = fVar48 * local_cc;
      fVar6 = *(float *)(pppppppuVar19 + 8);
      local_d4 = fVar6 * local_b8 + fVar3 * fVar36 + fVar2 * local_d4 + fVar35 * fVar1;
      fVar7 = *(float *)((long)pppppppuVar19 + 0x24);
      fVar37 = *(float *)(pppppppuVar19 + 5);
      fVar32 = fVar35 * fVar37;
      fVar46 = local_d0 * fVar37;
      fVar52 = fVar53 * fVar37;
      fVar37 = fVar37 * fVar39;
      fVar21 = fVar39 * fVar43;
      fVar8 = *(float *)((long)pppppppuVar19 + 0x44);
      fVar35 = fVar8 * local_b8 + fVar4 * fVar36 + fVar34 + fVar35 * fVar7;
      fVar22 = fVar49 * fVar47;
      fVar38 = fVar44 * fVar47;
      fVar47 = fVar47 * fVar30;
      fVar34 = *(float *)(pppppppuVar19 + 9);
      fVar36 = fVar34 * local_b8 + fVar5 * fVar36 + fVar28 + fVar32;
      fVar28 = *(float *)((long)pppppppuVar19 + 0x4c);
      local_b8 = local_b8 * fVar28 + fVar50 + fVar51 + fVar40;
      fVar32 = local_d0 * fVar43;
      fVar27 = fVar6 * local_b4 + fVar3 * fVar49 + fVar2 * fVar27 + local_d0 * fVar1;
      local_d0 = fVar8 * local_b4 + fVar4 * fVar49 + fVar41 + local_d0 * fVar7;
      fVar49 = fVar34 * local_b4 + fVar5 * fVar49 + fVar42 + fVar46;
      local_b4 = local_b4 * fVar28 + fVar22 + fVar24 + fVar32;
      fVar43 = fVar53 * fVar43;
      fVar23 = fVar6 * fVar33 + fVar3 * fVar44 + fVar2 * fVar23 + fVar53 * fVar1;
      fVar53 = fVar8 * fVar33 + fVar4 * fVar44 + fVar25 + fVar53 * fVar7;
      fVar44 = fVar34 * fVar33 + fVar5 * fVar44 + fVar26 + fVar52;
      fVar33 = fVar33 * fVar28 + fVar38 + fVar20 + fVar43;
      local_cc = fVar6 * fVar29 + fVar3 * fVar30 + fVar2 * local_cc + fVar1 * fVar39;
      fVar39 = fVar8 * fVar29 + fVar4 * fVar30 + fVar31 + fVar7 * fVar39;
      fVar30 = fVar34 * fVar29 + fVar5 * fVar30 + fVar45 + fVar37;
      fVar29 = fVar29 * fVar28 + fVar47 + fVar48 + fVar21;
    } while (pppppppuVar19 != (undefined8 *******)local_38);
    __return_storage_ptr__->a3 = fVar36;
    __return_storage_ptr__->a4 = local_b8;
    __return_storage_ptr__->b1 = fVar27;
    __return_storage_ptr__->b4 = local_b4;
    __return_storage_ptr__->c1 = fVar23;
    __return_storage_ptr__->c2 = fVar53;
    __return_storage_ptr__->d1 = local_cc;
    __return_storage_ptr__->d2 = fVar39;
    __return_storage_ptr__->d3 = fVar30;
  }
  __return_storage_ptr__->a1 = local_d4;
  __return_storage_ptr__->a2 = fVar35;
  __return_storage_ptr__->b2 = local_d0;
  __return_storage_ptr__->b3 = fVar49;
  __return_storage_ptr__->c3 = fVar44;
  __return_storage_ptr__->c4 = fVar33;
  __return_storage_ptr__->d4 = fVar29;
  pppppppuVar19 = (undefined8 *******)local_38;
  while (pppppppuVar19 != &local_38) {
    pppppppuVar10 = (undefined8 *******)*pppppppuVar19;
    operator_delete(pppppppuVar19);
    pppppppuVar19 = pppppppuVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent() const
{
    CX3DImporter_NodeElement* cur_node;
    std::list<aiMatrix4x4> matr;
    aiMatrix4x4 out_matr;

	// starting walk from current element to root
	cur_node = NodeElement_Cur;
	if(cur_node != nullptr)
	{
		do
		{
			// if cur_node is group then store group transformation matrix in list.
			if(cur_node->Type == CX3DImporter_NodeElement::ENET_Group) matr.push_back(((CX3DImporter_NodeElement_Group*)cur_node)->Transformation);

			cur_node = cur_node->Parent;
		} while(cur_node != nullptr);
	}

	// multiplicate all matrices in reverse order
	for(std::list<aiMatrix4x4>::reverse_iterator rit = matr.rbegin(); rit != matr.rend(); ++rit) out_matr = out_matr * (*rit);

	return out_matr;
}